

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myBucket.h
# Opt level: O2

bitcoin * __thiscall myBucket_chain<bitcoin>::getData(myBucket_chain<bitcoin> *this,myString *key)

{
  bitcoin *this_00;
  l_node<myBucket<bitcoin>_> *plVar1;
  bool bVar2;
  l_node<myBucket<bitcoin>_> **pplVar3;
  
  pplVar3 = &(this->myBucketList).head;
  do {
    plVar1 = *pplVar3;
    this_00 = &(plVar1->data)._data;
    bVar2 = bitcoin::operator==(this_00,key);
    pplVar3 = &plVar1->next;
  } while (!bVar2);
  return this_00;
}

Assistant:

T* getData(myString key)  {



        for (  auto &dataNode : myBucketList) { //dataNode : myBucket<T>
            if (dataNode == key){

                return dataNode.get_data();
            }

        }
        assert(1);//means that we didnt found the data that we were expecting
    }